

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::TextureUnitCase::~TextureUnitCase(TextureUnitCase *this)

{
  TextureUnitCase *this_local;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureUnitCase_032916c0;
  deinit(this);
  std::vector<int,_std::allocator<int>_>::~vector(&this->m_ndxTexType);
  std::vector<int,_std::allocator<int>_>::~vector(&this->m_unitTextures);
  std::vector<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>::~vector(&this->m_textures3d);
  std::vector<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>::~vector
            (&this->m_textures2dArray);
  std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::~vector
            (&this->m_texturesCube);
  std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>::~vector(&this->m_textures2d);
  std::
  vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
  ::~vector(&this->m_textureParams);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_textureTypes);
  gles3::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TextureUnitCase::~TextureUnitCase (void)
{
	TextureUnitCase::deinit();
}